

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long __thiscall mkvparser::Segment::ParseCues(Segment *this,longlong off,longlong *pos,long *len)

{
  long element_start_00;
  bool bVar1;
  int iVar2;
  longlong lVar3;
  Segment *size_;
  long lVar4;
  Cues *this_00;
  Cues *local_d0;
  long local_c0;
  longlong element_size;
  longlong element_stop;
  longlong size;
  longlong id;
  longlong idpos;
  longlong result;
  longlong segment_stop;
  longlong element_start;
  long lStack_40;
  int status;
  longlong avail;
  longlong total;
  long *len_local;
  longlong *pos_local;
  longlong off_local;
  Segment *this_local;
  
  if (this->m_pCues == (Cues *)0x0) {
    if (off < 0) {
      this_local = (Segment *)0xffffffffffffffff;
    }
    else {
      total = (longlong)len;
      len_local = pos;
      pos_local = (longlong *)off;
      off_local = (longlong)this;
      iVar2 = (*this->m_pReader->_vptr_IMkvReader[1])
                        (this->m_pReader,&avail,&stack0xffffffffffffffc0);
      if (iVar2 < 0) {
        this_local = (Segment *)(long)iVar2;
      }
      else {
        if (-1 < avail && avail < lStack_40) {
          __assert_fail("(total < 0) || (avail <= total)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x670,"long mkvparser::Segment::ParseCues(long long, long long &, long &)")
          ;
        }
        *len_local = this->m_start + (long)pos_local;
        if ((avail < 0) || (avail <= *len_local)) {
          this_local = (Segment *)0x1;
        }
        else {
          element_start_00 = *len_local;
          if (this->m_size < 0) {
            local_c0 = -1;
          }
          else {
            local_c0 = this->m_start + this->m_size;
          }
          if (lStack_40 < *len_local + 1) {
            *(undefined8 *)total = 1;
            this_local = (Segment *)0xfffffffffffffffd;
          }
          else {
            this_local = (Segment *)GetUIntLength(this->m_pReader,*len_local,(long *)total);
            if (-1 < (long)this_local) {
              if ((long)this_local < 1) {
                if ((local_c0 < 0) || (*len_local + *(long *)total <= local_c0)) {
                  if (lStack_40 < *len_local + *(long *)total) {
                    this_local = (Segment *)0xfffffffffffffffd;
                  }
                  else {
                    lVar3 = ReadID(this->m_pReader,*len_local,(long *)total);
                    if (lVar3 == 0x1c53bb6b) {
                      *len_local = *(long *)total + *len_local;
                      bVar1 = true;
                      if (-1 < local_c0) {
                        bVar1 = *len_local <= local_c0;
                      }
                      if (!bVar1) {
                        __assert_fail("(segment_stop < 0) || (pos <= segment_stop)",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                                      ,0x698,
                                      "long mkvparser::Segment::ParseCues(long long, long long &, long &)"
                                     );
                      }
                      if (lStack_40 < *len_local + 1) {
                        *(undefined8 *)total = 1;
                        this_local = (Segment *)0xfffffffffffffffd;
                      }
                      else {
                        this_local = (Segment *)
                                     GetUIntLength(this->m_pReader,*len_local,(long *)total);
                        if (-1 < (long)this_local) {
                          if ((long)this_local < 1) {
                            if ((local_c0 < 0) || (*len_local + *(long *)total <= local_c0)) {
                              if (lStack_40 < *len_local + *(long *)total) {
                                this_local = (Segment *)0xfffffffffffffffd;
                              }
                              else {
                                size_ = (Segment *)
                                        ReadUInt(this->m_pReader,*len_local,(long *)total);
                                this_local = size_;
                                if (-1 < (long)size_) {
                                  if (size_ == (Segment *)0x0) {
                                    this_local = (Segment *)0x1;
                                  }
                                  else {
                                    *len_local = *(long *)total + *len_local;
                                    bVar1 = true;
                                    if (-1 < local_c0) {
                                      bVar1 = *len_local <= local_c0;
                                    }
                                    if (!bVar1) {
                                      __assert_fail("(segment_stop < 0) || (pos <= segment_stop)",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                                                  ,0x6bb,
                                                  "long mkvparser::Segment::ParseCues(long long, long long &, long &)"
                                                  );
                                    }
                                    lVar4 = (long)&size_->m_pReader + *len_local;
                                    if ((local_c0 < 0) || (lVar4 <= local_c0)) {
                                      if ((avail < 0) || (lVar4 <= avail)) {
                                        *(Segment **)total = size_;
                                        if (lStack_40 < lVar4) {
                                          this_local = (Segment *)0xfffffffffffffffd;
                                        }
                                        else {
                                          this_00 = (Cues *)operator_new(0x48,(nothrow_t *)
                                                                              &std::nothrow);
                                          local_d0 = (Cues *)0x0;
                                          if (this_00 != (Cues *)0x0) {
                                            Cues::Cues(this_00,this,*len_local,(longlong)size_,
                                                       element_start_00,lVar4 - element_start_00);
                                            local_d0 = this_00;
                                          }
                                          this->m_pCues = local_d0;
                                          if (this->m_pCues == (Cues *)0x0) {
                                            this_local = (Segment *)0xffffffffffffffff;
                                          }
                                          else {
                                            this_local = (Segment *)0x0;
                                          }
                                        }
                                      }
                                      else {
                                        this_local = (Segment *)0x1;
                                      }
                                    }
                                    else {
                                      this_local = (Segment *)0xfffffffffffffffe;
                                    }
                                  }
                                }
                              }
                            }
                            else {
                              this_local = (Segment *)0xfffffffffffffffe;
                            }
                          }
                          else {
                            *(undefined8 *)total = 1;
                            this_local = (Segment *)0xfffffffffffffffd;
                          }
                        }
                      }
                    }
                    else {
                      this_local = (Segment *)0xfffffffffffffffe;
                    }
                  }
                }
                else {
                  this_local = (Segment *)0xfffffffffffffffe;
                }
              }
              else {
                *(undefined8 *)total = 1;
                this_local = (Segment *)0xfffffffffffffffd;
              }
            }
          }
        }
      }
    }
  }
  else {
    this_local = (Segment *)0x0;
  }
  return (long)this_local;
}

Assistant:

long Segment::ParseCues(long long off, long long& pos, long& len) {
  if (m_pCues)
    return 0;  // success

  if (off < 0)
    return -1;

  long long total, avail;

  const int status = m_pReader->Length(&total, &avail);

  if (status < 0)  // error
    return status;

  assert((total < 0) || (avail <= total));

  pos = m_start + off;

  if ((total < 0) || (pos >= total))
    return 1;  // don't bother parsing cues

  const long long element_start = pos;
  const long long segment_stop = (m_size < 0) ? -1 : m_start + m_size;

  if ((pos + 1) > avail) {
    len = 1;
    return E_BUFFER_NOT_FULL;
  }

  long long result = GetUIntLength(m_pReader, pos, len);

  if (result < 0)  // error
    return static_cast<long>(result);

  if (result > 0)  // underflow (weird)
  {
    len = 1;
    return E_BUFFER_NOT_FULL;
  }

  if ((segment_stop >= 0) && ((pos + len) > segment_stop))
    return E_FILE_FORMAT_INVALID;

  if ((pos + len) > avail)
    return E_BUFFER_NOT_FULL;

  const long long idpos = pos;

  const long long id = ReadID(m_pReader, idpos, len);

  if (id != libwebm::kMkvCues)
    return E_FILE_FORMAT_INVALID;

  pos += len;  // consume ID
  assert((segment_stop < 0) || (pos <= segment_stop));

  // Read Size

  if ((pos + 1) > avail) {
    len = 1;
    return E_BUFFER_NOT_FULL;
  }

  result = GetUIntLength(m_pReader, pos, len);

  if (result < 0)  // error
    return static_cast<long>(result);

  if (result > 0)  // underflow (weird)
  {
    len = 1;
    return E_BUFFER_NOT_FULL;
  }

  if ((segment_stop >= 0) && ((pos + len) > segment_stop))
    return E_FILE_FORMAT_INVALID;

  if ((pos + len) > avail)
    return E_BUFFER_NOT_FULL;

  const long long size = ReadUInt(m_pReader, pos, len);

  if (size < 0)  // error
    return static_cast<long>(size);

  if (size == 0)  // weird, although technically not illegal
    return 1;  // done

  pos += len;  // consume length of size of element
  assert((segment_stop < 0) || (pos <= segment_stop));

  // Pos now points to start of payload

  const long long element_stop = pos + size;

  if ((segment_stop >= 0) && (element_stop > segment_stop))
    return E_FILE_FORMAT_INVALID;

  if ((total >= 0) && (element_stop > total))
    return 1;  // don't bother parsing anymore

  len = static_cast<long>(size);

  if (element_stop > avail)
    return E_BUFFER_NOT_FULL;

  const long long element_size = element_stop - element_start;

  m_pCues =
      new (std::nothrow) Cues(this, pos, size, element_start, element_size);
  if (m_pCues == NULL)
    return -1;

  return 0;  // success
}